

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

void * rw::d3d9::createVertexDeclaration(VertexElement *elements)

{
  void *__dest;
  long lVar1;
  int iVar2;
  VertexElement *e;
  int n;
  VertexElement *elements_local;
  
  e._4_4_ = 0;
  do {
    iVar2 = e._4_4_ + 1;
    lVar1 = (long)e._4_4_;
    e._4_4_ = iVar2;
  } while (elements[lVar1].stream != 0xff);
  __dest = mustmalloc_LOC((long)iVar2 << 3,0x30b00,
                          "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 84"
                         );
  memcpy(__dest,elements,(long)iVar2 << 3);
  return __dest;
}

Assistant:

void*
createVertexDeclaration(VertexElement *elements)
{
#ifdef RW_D3D9
	IDirect3DVertexDeclaration9 *decl = 0;
	d3ddevice->CreateVertexDeclaration((D3DVERTEXELEMENT9*)elements, &decl);
	if(decl)
		d3d9Globals.numVertexDeclarations++;
	return decl;
#else
	int n = 0;
	VertexElement *e = (VertexElement*)elements;
	while(e[n++].stream != 0xFF)
		;
	e = rwNewT(VertexElement, n, MEMDUR_EVENT | ID_DRIVER);
	memcpy(e, elements, n*sizeof(VertexElement));
	return e;
#endif
}